

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_vstat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *argument_00;
  char arg [4608];
  char local_1228 [4616];
  
  argument_00 = one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  vstat mob [vnum]\n\r",ch);
    send_to_char("  vstat obj [vnum]\n\r",ch);
    send_to_char("Default is obj.\n\r",ch);
  }
  else {
    bVar1 = str_cmp(local_1228,"mob");
    if (bVar1) {
      bVar1 = str_cmp(local_1228,"obj");
      if (bVar1) {
        argument_00 = argument;
      }
      do_vostat(ch,argument_00);
    }
    else {
      do_vmstat(ch,argument_00);
    }
  }
  return;
}

Assistant:

void do_vstat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *choppedarg;
	choppedarg = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  vstat mob [vnum]\n\r", ch);
		send_to_char("  vstat obj [vnum]\n\r", ch);
		send_to_char("Default is obj.\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "mob"))
	{
		do_vmstat(ch, choppedarg);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_vostat(ch, choppedarg);
		return;
	}

	/* default = obj */
	do_vostat(ch, argument);
}